

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

TPZManVector<std::complex<double>,_1000> * __thiscall
TPZManVector<std::complex<double>,_1000>::operator=
          (TPZManVector<std::complex<double>,_1000> *this,
          TPZManVector<std::complex<double>,_1000> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long lVar4;
  complex<double> *pcVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  if (this != copy) {
    uVar7 = (copy->super_TPZVec<std::complex<double>_>).fNElements;
    lVar4 = (this->super_TPZVec<std::complex<double>_>).fNAlloc;
    if ((lVar4 < (long)uVar7) &&
       (pcVar5 = (this->super_TPZVec<std::complex<double>_>).fStore,
       pcVar5 != this->fExtAlloc && pcVar5 != (complex<double> *)0x0)) {
      operator_delete__(pcVar5);
      (this->super_TPZVec<std::complex<double>_>).fStore = (complex<double> *)0x0;
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = 0;
      lVar4 = 0;
    }
    if ((long)uVar7 < 0x3e9) {
      pcVar5 = (this->super_TPZVec<std::complex<double>_>).fStore;
      if (pcVar5 != (complex<double> *)0x0 && pcVar5 != this->fExtAlloc) {
        operator_delete__(pcVar5);
      }
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = 0;
      (this->super_TPZVec<std::complex<double>_>).fStore = this->fExtAlloc;
    }
    else if (lVar4 < (long)uVar7) {
      pcVar5 = (complex<double> *)operator_new__(-(ulong)(uVar7 >> 0x3c != 0) | uVar7 << 4);
      memset(pcVar5,0,uVar7 << 4);
      (this->super_TPZVec<std::complex<double>_>).fStore = pcVar5;
      (this->super_TPZVec<std::complex<double>_>).fNAlloc = uVar7;
    }
    (this->super_TPZVec<std::complex<double>_>).fNElements = uVar7;
    uVar6 = 0;
    if ((long)uVar7 < 1) {
      uVar7 = uVar6;
    }
    while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      puVar1 = (undefined8 *)
               (((copy->super_TPZVec<std::complex<double>_>).fStore)->_M_value + uVar6);
      uVar3 = puVar1[1];
      puVar2 = (undefined8 *)
               (((this->super_TPZVec<std::complex<double>_>).fStore)->_M_value + uVar6);
      *puVar2 = *puVar1;
      puVar2[1] = uVar3;
      uVar6 = uVar6 + 0x10;
    }
  }
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(const TPZManVector< T, NumExtAlloc >& copy) {
    // Checking auto assignment.
    if (this != &copy) {
      const int64_t nel = copy.NElements();

      if (nel > this->fNAlloc && this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = 0;
        this->fNAlloc = 0;
      }

      if (nel <= NumExtAlloc) {
        if (this->fStore != fExtAlloc) {
          delete[] this->fStore;
        }
        this->fNAlloc = 0;
        this->fStore = fExtAlloc;
        this->fNElements = nel;
      } else if (this->fNAlloc >= nel) {
        this->fNElements = nel;
      } else {
        this->fStore = new T[nel];
        this->fNAlloc = nel;
        this->fNElements = nel;
      }

      for (int64_t i = 0; i < nel; i++) {
        this->fStore[i] = copy.fStore[i];
      }
    }
    return *this;
}